

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::contains
          (SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *this,uint *key)

{
  uint uVar1;
  uint *item;
  uint i;
  uint local_24;
  uint bucket;
  uint bucketMask;
  uint *key_local;
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *this_local;
  
  local_24 = this->bucketCount - 1;
  _bucket = key;
  key_local = &this->bucketCount;
  uVar1 = SmallDenseMapUnsignedHasher::operator()
                    ((SmallDenseMapUnsignedHasher *)((long)&item + 7),*key);
  item._0_4_ = 0;
  while( true ) {
    i = uVar1 & local_24;
    if (this->bucketCount <= (uint)item) {
      return false;
    }
    if (this->data[i] == 0) break;
    if (this->data[i] == *_bucket) {
      return true;
    }
    uVar1 = i + (uint)item + 1;
    item._0_4_ = (uint)item + 1;
  }
  return false;
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}